

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

void __thiscall libDAI::TFactor<double>::TFactor(TFactor<double> *this,TFactor<double> *x)

{
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)this,
             (vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)x);
  (this->_vs)._statespace = (x->_vs)._statespace;
  std::vector<double,_std::allocator<double>_>::vector(&(this->_p)._p,&(x->_p)._p);
  return;
}

Assistant:

TFactor( const TFactor<T> &x ) : _vs(x._vs), _p(x._p) {}